

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void cimg_library::CImgDisplay::_render_resize<unsigned_int,unsigned_int>
               (uint *ptrs,uint ws,uint hs,uint *ptrd,uint wd,uint hd)

{
  uint *puVar1;
  uint *puVar2;
  float fVar3;
  uint local_70;
  uint local_6c;
  uint dy;
  uint x_1;
  uint *ptr;
  uint y_1;
  uint y;
  uint x;
  float old;
  float curr;
  float s;
  uint *poffy;
  uint *poffx;
  uint *offy;
  uint *offx;
  uint hd_local;
  uint wd_local;
  uint *ptrd_local;
  uint hs_local;
  uint ws_local;
  uint *ptrs_local;
  
  puVar1 = (uint *)operator_new__((ulong)wd << 2);
  puVar2 = (uint *)operator_new__((ulong)(hd + 1) << 2);
  x = 0;
  poffy = puVar1;
  for (y_1 = 0; y_1 < wd; y_1 = y_1 + 1) {
    fVar3 = (float)x + (float)ws / (float)wd;
    *poffy = (int)(long)fVar3 - (int)(long)(float)x;
    x = (uint)fVar3;
    poffy = poffy + 1;
  }
  x = 0;
  _curr = puVar2;
  for (ptr._4_4_ = 0; ptr._4_4_ < hd; ptr._4_4_ = ptr._4_4_ + 1) {
    fVar3 = (float)x + (float)hs / (float)hd;
    *_curr = ws * ((int)(long)fVar3 - (int)(long)(float)x);
    x = (uint)fVar3;
    _curr = _curr + 1;
  }
  *_curr = 0;
  ptr._0_4_ = 0;
  _curr = puVar2;
  _hd_local = ptrd;
  _hs_local = ptrs;
  while ((uint)ptr < hd) {
    _dy = _hs_local;
    poffy = puVar1;
    for (local_6c = 0; local_6c < wd; local_6c = local_6c + 1) {
      *_hd_local = *_dy;
      _dy = _dy + *poffy;
      poffy = poffy + 1;
      _hd_local = _hd_local + 1;
    }
    local_70 = *_curr;
    while( true ) {
      _curr = _curr + 1;
      ptr._0_4_ = (uint)ptr + 1;
      if (local_70 != 0 || hd <= (uint)ptr) break;
      memcpy(_hd_local,_hd_local + -(ulong)wd,(ulong)wd << 2);
      _hd_local = _hd_local + wd;
      local_70 = *_curr;
    }
    _hs_local = _hs_local + local_70;
  }
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
  }
  if (puVar2 != (uint *)0x0) {
    operator_delete__(puVar2);
  }
  return;
}

Assistant:

static void _render_resize(const T *ptrs, const unsigned int ws, const unsigned int hs,
                               t *ptrd, const unsigned int wd, const unsigned int hd) {
      unsigned int *const offx = new unsigned int[wd], *const offy = new unsigned int[hd+1], *poffx, *poffy;
      float s, curr, old;
      s = (float)ws/wd;
      poffx = offx; curr = 0; for (unsigned int x = 0; x<wd; ++x) { old = curr; curr+=s; *(poffx++) = (unsigned int)curr - (unsigned int)old; }
      s = (float)hs/hd;
      poffy = offy; curr = 0; for (unsigned int y = 0; y<hd; ++y) { old = curr; curr+=s; *(poffy++) = ws*((unsigned int)curr - (unsigned int)old); }
      *poffy = 0;
      poffy = offy;
      for (unsigned int y = 0; y<hd; ) {
        const T *ptr = ptrs;
        poffx = offx;
        for (unsigned int x = 0; x<wd; ++x) { *(ptrd++) = *ptr; ptr+=*(poffx++); }
        ++y;
        unsigned int dy = *(poffy++);
        for ( ; !dy && y<hd; std::memcpy(ptrd,ptrd - wd,sizeof(t)*wd), ++y, ptrd+=wd, dy = *(poffy++)) {}
        ptrs+=dy;
      }
      delete[] offx; delete[] offy;
    }